

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::csharp::CSharpGenerator::DestinationCast_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type)

{
  BaseType BVar1;
  long lVar2;
  long *plVar3;
  EnumDef **ppEVar4;
  size_type *psVar5;
  Type local_50;
  string local_30;
  
  BVar1 = type->base_type;
  if ((BVar1 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) &&
     ((0x64000U >> (BVar1 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
    local_50.struct_def = type->struct_def;
    local_50.enum_def = type->enum_def;
    local_50.element = BASE_TYPE_NONE;
    local_50.base_type = type->element;
    local_50.fixed_length = type->fixed_length;
    DestinationCast_abi_cxx11_(__return_storage_ptr__,this,&local_50);
  }
  else if (BVar1 - BASE_TYPE_UTYPE < 10 && type->enum_def != (EnumDef *)0x0) {
    NamespacedName_abi_cxx11_(&local_30,this,&type->enum_def->super_Definition);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x3889d5);
    ppEVar4 = (EnumDef **)(plVar3 + 2);
    if ((EnumDef **)*plVar3 == ppEVar4) {
      local_50.enum_def = *ppEVar4;
      local_50._24_8_ = plVar3[3];
      local_50._0_8_ = &local_50.enum_def;
    }
    else {
      local_50.enum_def = *ppEVar4;
      local_50._0_8_ = (EnumDef **)*plVar3;
    }
    local_50.struct_def = (StructDef *)plVar3[1];
    *plVar3 = (long)ppEVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((EnumDef **)local_50._0_8_ != &local_50.enum_def) {
      operator_delete((void *)local_50._0_8_,
                      (ulong)((long)&((local_50.enum_def)->super_Definition).name._M_dataplus._M_p +
                             1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DestinationCast(const Type &type) const {
    if (IsSeries(type)) {
      return DestinationCast(type.VectorType());
    } else {
      if (IsEnum(type)) return "(" + NamespacedName(*type.enum_def) + ")";
    }
    return "";
  }